

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_node_notif(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  lysp_node *plVar1;
  lys_module *plVar2;
  LY_ERR LVar3;
  long *plVar4;
  lysp_ext_instance *plVar5;
  lysp_ext_instance *plVar6;
  long lVar7;
  lysp_restr *must_p;
  long lVar8;
  long lVar9;
  lysp_node **pplVar10;
  
  plVar1 = pnode[1].parent;
  if (plVar1 != (lysp_node *)0x0) {
    plVar2 = node[1].module;
    if (plVar2 == (lys_module *)0x0) {
      plVar4 = (long *)calloc(1,(long)plVar1[-1].exts * 0x38 + 8);
      if (plVar4 == (long *)0x0) goto LAB_0014935e;
      lVar7 = 0;
      lVar8 = 0;
    }
    else {
      lVar8 = *(long *)&plVar2[-1].implemented;
      plVar4 = (long *)realloc(&plVar2[-1].implemented,
                               ((long)&(plVar1[-1].exts)->name + lVar8 * 2) * 0x38 + 8);
      if (plVar4 == (long *)0x0) {
LAB_0014935e:
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_notif"
              );
        return LY_EMEM;
      }
      lVar7 = *plVar4;
    }
    node[1].module = (lys_module *)(plVar4 + 1);
    if (pnode[1].parent == (lysp_node *)0x0) {
      plVar5 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar5 = pnode[1].parent[-1].exts;
    }
    lVar9 = 0;
    memset(plVar4 + lVar7 * 7 + 1,0,((long)&plVar5->name + lVar8) * 0x38);
    plVar5 = (lysp_ext_instance *)0xffffffffffffffff;
    while( true ) {
      plVar1 = pnode[1].parent;
      if (plVar1 == (lysp_node *)0x0) {
        plVar6 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar6 = plVar1[-1].exts;
      }
      plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
      if (plVar6 <= plVar5) break;
      plVar2 = node[1].module;
      lVar8 = *(long *)&plVar2[-1].implemented;
      *(long *)&plVar2[-1].implemented = lVar8 + 1;
      must_p = (lysp_restr *)((long)&plVar1->parent + lVar9);
      lVar9 = lVar9 + 0x40;
      LVar3 = lys_compile_must(ctx,must_p,(lysc_must *)(&plVar2->ctx + lVar8 * 7));
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
  }
  LVar3 = lysc_unres_must_add(ctx,node,pnode);
  if (LVar3 != LY_SUCCESS) {
    return LY_EMEM;
  }
  pplVar10 = (lysp_node **)&pnode[1].name;
  do {
    plVar1 = *pplVar10;
    if (plVar1 == (lysp_node *)0x0) {
      LVar3 = lys_compile_node_augments(ctx,node);
      return LVar3;
    }
    LVar3 = lys_compile_node(ctx,plVar1,node,0,(ly_set *)0x0);
    pplVar10 = &plVar1->next;
  } while (LVar3 == LY_SUCCESS);
  return LVar3;
}

Assistant:

static LY_ERR
lys_compile_node_notif(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node_notif *notif_p = (struct lysp_node_notif *)pnode;
    struct lysc_node_notif *notif = (struct lysc_node_notif *)node;
    struct lysp_node *child_p;

    COMPILE_ARRAY_GOTO(ctx, notif_p->musts, notif->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    LY_LIST_FOR(notif_p->child, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

done:
    return ret;
}